

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O1

int apply_patch(cJSON *object,cJSON *patch,cJSON_bool case_sensitive)

{
  uchar *puVar1;
  int iVar2;
  cJSON_bool cVar3;
  long lVar4;
  long lVar5;
  cJSON *pcVar6;
  cJSON *pcVar7;
  uchar *__s;
  char *pcVar8;
  uchar *pointer;
  cJSON *array;
  uchar *puVar9;
  uchar *puVar10;
  uint uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  uint local_50;
  size_t local_40;
  size_t index;
  
  index = *(size_t *)(in_FS_OFFSET + 0x28);
  if (case_sensitive == 0) {
    lVar4 = cJSON_GetObjectItem(patch,"path");
  }
  else {
    lVar4 = cJSON_GetObjectItemCaseSensitive();
  }
  iVar2 = cJSON_IsString(lVar4);
  if (iVar2 == 0) {
    local_50 = 2;
LAB_0010189c:
    pcVar7 = (cJSON *)0x0;
  }
  else {
    if (case_sensitive == 0) {
      lVar5 = cJSON_GetObjectItem(patch,"op");
    }
    else {
      lVar5 = cJSON_GetObjectItemCaseSensitive();
    }
    iVar2 = cJSON_IsString(lVar5);
    if (iVar2 == 0) {
      uVar11 = 0;
    }
    else {
      pcVar8 = *(char **)(lVar5 + 0x20);
      iVar2 = strcmp(pcVar8,"add");
      if (iVar2 == 0) {
        uVar11 = 1;
      }
      else {
        iVar2 = strcmp(pcVar8,"remove");
        if (iVar2 == 0) {
          uVar11 = 2;
        }
        else {
          iVar2 = strcmp(pcVar8,"replace");
          if (iVar2 == 0) {
            uVar11 = 3;
          }
          else {
            iVar2 = strcmp(pcVar8,"move");
            if (iVar2 == 0) {
              uVar11 = 4;
            }
            else {
              iVar2 = strcmp(pcVar8,"copy");
              if (iVar2 == 0) {
                uVar11 = 5;
              }
              else {
                iVar2 = strcmp(pcVar8,"test");
                uVar11 = 6;
                if (iVar2 != 0) {
                  uVar11 = 0;
                }
              }
            }
          }
        }
      }
    }
    if (uVar11 == 0) {
      local_50 = 3;
      goto LAB_0010189c;
    }
    if (uVar11 == 6) {
      pcVar6 = get_item_from_pointer(object,*(char **)(lVar4 + 0x20),case_sensitive);
      if (case_sensitive == 0) {
        pcVar7 = (cJSON *)cJSON_GetObjectItem(patch,"value");
      }
      else {
        pcVar7 = (cJSON *)cJSON_GetObjectItemCaseSensitive();
      }
      cVar3 = compare_json(pcVar6,pcVar7,case_sensitive);
      local_50 = (uint)(cVar3 == 0);
      goto LAB_0010189c;
    }
    if (**(uchar **)(lVar4 + 0x20) == '\0') {
      if (uVar11 == 2) {
        overwrite_item(object,(cJSON)ZEXT1664(ZEXT816(0)));
LAB_00101906:
        __s = (uchar *)0x0;
        local_50 = 0;
        pcVar6 = (cJSON *)0x0;
        goto LAB_001018a2;
      }
      if ((uVar11 & 0xfffffffd) != 1) goto LAB_00101830;
      pcVar6 = get_object_item(patch,"value",case_sensitive);
      if (pcVar6 != (cJSON *)0x0) {
        pcVar6 = (cJSON *)cJSON_Duplicate(pcVar6,1);
        local_50 = 0;
        if (pcVar6 != (cJSON *)0x0) {
          overwrite_item(object,*pcVar6);
          cJSON_free(pcVar6);
          if (object->string == (char *)0x0) goto LAB_0010189c;
          cJSON_free();
          object->string = (char *)0x0;
          goto LAB_00101906;
        }
        goto LAB_00101a53;
      }
LAB_00101a5e:
      local_50 = 7;
      goto LAB_0010189c;
    }
LAB_00101830:
    local_50 = 0;
    if ((uVar11 & 0xfffffffe) == 2) {
      pcVar6 = detach_path(object,*(uchar **)(lVar4 + 0x20),case_sensitive);
      local_50 = 0;
      if (pcVar6 == (cJSON *)0x0) {
        local_50 = 0xd;
      }
      else {
        cJSON_Delete(pcVar6);
      }
      if (pcVar6 == (cJSON *)0x0 || uVar11 == 2) {
        __s = (uchar *)0x0;
        pcVar6 = (cJSON *)0x0;
        goto LAB_001018a2;
      }
    }
    if ((uVar11 & 0xfffffffe) != 4) {
      if (case_sensitive == 0) {
        lVar5 = cJSON_GetObjectItem(patch,"value");
      }
      else {
        lVar5 = cJSON_GetObjectItemCaseSensitive();
      }
      if (lVar5 == 0) goto LAB_00101a5e;
      pcVar7 = (cJSON *)cJSON_Duplicate(lVar5,1);
      if (pcVar7 == (cJSON *)0x0) {
LAB_00101a53:
        local_50 = 8;
        goto LAB_0010189c;
      }
LAB_00101adc:
      __s = cJSONUtils_strdup(*(uchar **)(lVar4 + 0x20));
      if (__s == (uchar *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = strrchr((char *)__s,0x2f);
      }
      if (pcVar8 == (char *)0x0) {
        pointer = (uchar *)0x0;
      }
      else {
        *pcVar8 = '\0';
        pointer = (uchar *)(pcVar8 + 1);
      }
      array = get_item_from_pointer(object,(char *)__s,case_sensitive);
      puVar9 = pointer;
      puVar10 = pointer;
      if (pointer != (uchar *)0x0) {
        do {
          if (*puVar9 == '~') {
            puVar1 = puVar9 + 1;
            puVar9 = puVar9 + 1;
            if (*puVar1 == '1') {
              puVar10[1] = '/';
            }
            else {
              if (*puVar1 != '0') break;
              *puVar10 = '~';
            }
          }
          else if (*puVar9 == '\0') goto LAB_00101b5a;
          puVar9 = puVar9 + 1;
          puVar10 = puVar10 + 1;
        } while( true );
      }
      goto LAB_00101b5d;
    }
    if (case_sensitive == 0) {
      lVar5 = cJSON_GetObjectItem(patch,"from");
    }
    else {
      lVar5 = cJSON_GetObjectItemCaseSensitive();
    }
    if (lVar5 == 0) {
      uVar11 = 4;
LAB_00101acb:
      pcVar7 = (cJSON *)0x0;
      bVar12 = false;
    }
    else {
      if (uVar11 == 4) {
        pcVar7 = detach_path(object,*(uchar **)(lVar5 + 0x20),case_sensitive);
      }
      else {
        pcVar7 = (cJSON *)0x0;
      }
      if (uVar11 == 5) {
        pcVar7 = get_item_from_pointer(object,*(char **)(lVar5 + 0x20),case_sensitive);
      }
      if (pcVar7 == (cJSON *)0x0) {
        uVar11 = 5;
        goto LAB_00101acb;
      }
      if (uVar11 == 5) {
        pcVar7 = (cJSON *)cJSON_Duplicate(pcVar7,1);
      }
      bVar12 = pcVar7 != (cJSON *)0x0;
      uVar11 = 6;
      if (bVar12) {
        uVar11 = local_50;
      }
    }
    local_50 = uVar11;
    if (bVar12) goto LAB_00101adc;
  }
  __s = (uchar *)0x0;
  pcVar6 = pcVar7;
LAB_001018a2:
  if (pcVar6 != (cJSON *)0x0) {
    cJSON_Delete(pcVar6);
  }
  if (__s != (uchar *)0x0) {
    cJSON_free(__s);
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) == index) {
    return local_50;
  }
  __stack_chk_fail();
LAB_00101b5a:
  *puVar10 = '\0';
LAB_00101b5d:
  pcVar6 = pcVar7;
  if (array == (cJSON *)0x0 || pointer == (uchar *)0x0) {
LAB_00101b6d:
    local_50 = 9;
  }
  else {
    iVar2 = cJSON_IsArray(array);
    if (iVar2 == 0) {
      iVar2 = cJSON_IsObject(array);
      if (iVar2 == 0) goto LAB_00101b6d;
      if (case_sensitive == 0) {
        cJSON_DeleteItemFromObject(array,pointer);
      }
      else {
        cJSON_DeleteItemFromObjectCaseSensitive(array,pointer);
      }
      cJSON_AddItemToObject(array,pointer,pcVar7);
    }
    else {
      iVar2 = strcmp((char *)pointer,"-");
      if (iVar2 != 0) {
        local_40 = 0;
        cVar3 = decode_array_index_from_pointer(pointer,&local_40);
        if (cVar3 == 0) {
          local_50 = 0xb;
        }
        else {
          cVar3 = insert_item_in_array(array,local_40,pcVar7);
          pcVar6 = (cJSON *)0x0;
          if (cVar3 == 0) {
            local_50 = 10;
            pcVar6 = pcVar7;
          }
        }
        goto LAB_001018a2;
      }
      cJSON_AddItemToArray(array,pcVar7);
    }
    pcVar6 = (cJSON *)0x0;
  }
  goto LAB_001018a2;
}

Assistant:

static int apply_patch(cJSON *object, const cJSON *patch, const cJSON_bool case_sensitive)
{
    cJSON *path = NULL;
    cJSON *value = NULL;
    cJSON *parent = NULL;
    enum patch_operation opcode = INVALID;
    unsigned char *parent_pointer = NULL;
    unsigned char *child_pointer = NULL;
    int status = 0;

    path = get_object_item(patch, "path", case_sensitive);
    if (!cJSON_IsString(path))
    {
        /* malformed patch. */
        status = 2;
        goto cleanup;
    }

    opcode = decode_patch_operation(patch, case_sensitive);
    if (opcode == INVALID)
    {
        status = 3;
        goto cleanup;
    }
    else if (opcode == TEST)
    {
        /* compare value: {...} with the given path */
        status = !compare_json(get_item_from_pointer(object, path->valuestring, case_sensitive), get_object_item(patch, "value", case_sensitive), case_sensitive);
        goto cleanup;
    }

    /* special case for replacing the root */
    if (path->valuestring[0] == '\0')
    {
        if (opcode == REMOVE)
        {
            static const cJSON invalid = { NULL, NULL, NULL, cJSON_Invalid, NULL, 0, 0, NULL};

            overwrite_item(object, invalid);

            status = 0;
            goto cleanup;
        }

        if ((opcode == REPLACE) || (opcode == ADD))
        {
            value = get_object_item(patch, "value", case_sensitive);
            if (value == NULL)
            {
                /* missing "value" for add/replace. */
                status = 7;
                goto cleanup;
            }

            value = cJSON_Duplicate(value, 1);
            if (value == NULL)
            {
                /* out of memory for add/replace. */
                status = 8;
                goto cleanup;
            }

            overwrite_item(object, *value);

            /* delete the duplicated value */
            cJSON_free(value);
            value = NULL;

            /* the string "value" isn't needed */
            if (object->string != NULL)
            {
                cJSON_free(object->string);
                object->string = NULL;
            }

            status = 0;
            goto cleanup;
        }
    }

    if ((opcode == REMOVE) || (opcode == REPLACE))
    {
        /* Get rid of old. */
        cJSON *old_item = detach_path(object, (unsigned char*)path->valuestring, case_sensitive);
        if (old_item == NULL)
        {
            status = 13;
            goto cleanup;
        }
        cJSON_Delete(old_item);
        if (opcode == REMOVE)
        {
            /* For Remove, this job is done. */
            status = 0;
            goto cleanup;
        }
    }

    /* Copy/Move uses "from". */
    if ((opcode == MOVE) || (opcode == COPY))
    {
        cJSON *from = get_object_item(patch, "from", case_sensitive);
        if (from == NULL)
        {
            /* missing "from" for copy/move. */
            status = 4;
            goto cleanup;
        }

        if (opcode == MOVE)
        {
            value = detach_path(object, (unsigned char*)from->valuestring, case_sensitive);
        }
        if (opcode == COPY)
        {
            value = get_item_from_pointer(object, from->valuestring, case_sensitive);
        }
        if (value == NULL)
        {
            /* missing "from" for copy/move. */
            status = 5;
            goto cleanup;
        }
        if (opcode == COPY)
        {
            value = cJSON_Duplicate(value, 1);
        }
        if (value == NULL)
        {
            /* out of memory for copy/move. */
            status = 6;
            goto cleanup;
        }
    }
    else /* Add/Replace uses "value". */
    {
        value = get_object_item(patch, "value", case_sensitive);
        if (value == NULL)
        {
            /* missing "value" for add/replace. */
            status = 7;
            goto cleanup;
        }
        value = cJSON_Duplicate(value, 1);
        if (value == NULL)
        {
            /* out of memory for add/replace. */
            status = 8;
            goto cleanup;
        }
    }

    /* Now, just add "value" to "path". */

    /* split pointer in parent and child */
    parent_pointer = cJSONUtils_strdup((unsigned char*)path->valuestring);
    if (parent_pointer) {
        child_pointer = (unsigned char*)strrchr((char*)parent_pointer, '/');
    }
    if (child_pointer != NULL)
    {
        child_pointer[0] = '\0';
        child_pointer++;
    }
    parent = get_item_from_pointer(object, (char*)parent_pointer, case_sensitive);
    decode_pointer_inplace(child_pointer);

    /* add, remove, replace, move, copy, test. */
    if ((parent == NULL) || (child_pointer == NULL))
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }
    else if (cJSON_IsArray(parent))
    {
        if (strcmp((char*)child_pointer, "-") == 0)
        {
            cJSON_AddItemToArray(parent, value);
            value = NULL;
        }
        else
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer(child_pointer, &index))
            {
                status = 11;
                goto cleanup;
            }

            if (!insert_item_in_array(parent, index, value))
            {
                status = 10;
                goto cleanup;
            }
            value = NULL;
        }
    }
    else if (cJSON_IsObject(parent))
    {
        if (case_sensitive)
        {
            cJSON_DeleteItemFromObjectCaseSensitive(parent, (char*)child_pointer);
        }
        else
        {
            cJSON_DeleteItemFromObject(parent, (char*)child_pointer);
        }
        cJSON_AddItemToObject(parent, (char*)child_pointer, value);
        value = NULL;
    }
    else /* parent is not an object */
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }

cleanup:
    if (value != NULL)
    {
        cJSON_Delete(value);
    }
    if (parent_pointer != NULL)
    {
        cJSON_free(parent_pointer);
    }

    return status;
}